

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O3

AnalyzerChannelData * __thiscall SMBusAnalyzer::AdvanceAllTo(SMBusAnalyzer *this,U64 toSample)

{
  ulong uVar1;
  AnalyzerChannelData *pAVar2;
  
  uVar1 = AnalyzerChannelData::GetSampleNumber();
  if (toSample < uVar1) {
    __assert_fail("mSMBCLK->GetSampleNumber() <= toSample",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                  ,0x22,"AnalyzerChannelData *SMBusAnalyzer::AdvanceAllTo(U64)");
  }
  uVar1 = AnalyzerChannelData::GetSampleNumber();
  if (uVar1 <= toSample) {
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSMBCLK);
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSMBDAT);
    pAVar2 = GetNearestTransitionChannel(this);
    return pAVar2;
  }
  __assert_fail("mSMBDAT->GetSampleNumber() <= toSample",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                ,0x23,"AnalyzerChannelData *SMBusAnalyzer::AdvanceAllTo(U64)");
}

Assistant:

AnalyzerChannelData* SMBusAnalyzer::AdvanceAllTo( U64 toSample )
{
    assert( mSMBCLK->GetSampleNumber() <= toSample );
    assert( mSMBDAT->GetSampleNumber() <= toSample );

    mSMBCLK->AdvanceToAbsPosition( toSample );
    mSMBDAT->AdvanceToAbsPosition( toSample );

    return GetNearestTransitionChannel();
}